

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer.cpp
# Opt level: O2

void __thiscall duckdb::CSVBuffer::AllocateBuffer(CSVBuffer *this,idx_t buffer_size)

{
  bool bVar1;
  int iVar2;
  BufferManager *pBVar3;
  undefined4 extraout_var;
  BufferHandle local_40;
  
  pBVar3 = BufferManager::GetBufferManager(this->context);
  bVar1 = this->is_pipe;
  iVar2 = (*pBVar3->_vptr_BufferManager[0xf])(pBVar3);
  if (buffer_size < CONCAT44(extraout_var,iVar2)) {
    buffer_size = CONCAT44(extraout_var,iVar2);
  }
  (*pBVar3->_vptr_BufferManager[4])(&local_40,pBVar3,3,buffer_size,(ulong)(bVar1 ^ 1));
  BufferHandle::operator=(&this->handle,&local_40);
  BufferHandle::~BufferHandle(&local_40);
  shared_ptr<duckdb::BlockHandle,_true>::operator=(&this->block,&(this->handle).handle);
  return;
}

Assistant:

void CSVBuffer::AllocateBuffer(idx_t buffer_size) {
	auto &buffer_manager = BufferManager::GetBufferManager(context);
	bool can_destroy = !is_pipe;
	handle = buffer_manager.Allocate(MemoryTag::CSV_READER, MaxValue<idx_t>(buffer_manager.GetBlockSize(), buffer_size),
	                                 can_destroy);
	block = handle.GetBlockHandle();
}